

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrthogonalPackingSolver2D.h
# Opt level: O1

void __thiscall
tsbp::OrthogonalPackingSolver2D::OrthogonalPackingSolver2D
          (OrthogonalPackingSolver2D *this,
          vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *items,Bin *container,
          InputParameters *inputParameters)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined3 uVar9;
  
  CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::vector(&this->items,items);
  iVar2 = (container->super_Rectangle).X;
  iVar3 = (container->super_Rectangle).Y;
  iVar4 = (container->super_Rectangle).Dx;
  iVar5 = (container->super_Rectangle).Dy;
  iVar6 = (container->super_Rectangle).ExternId;
  uVar7 = *(undefined4 *)&(container->super_Rectangle).Area;
  uVar8 = *(undefined4 *)((long)&(container->super_Rectangle).Area + 4);
  (this->container).super_Rectangle.InternId = (container->super_Rectangle).InternId;
  (this->container).super_Rectangle.ExternId = iVar6;
  *(undefined4 *)&(this->container).super_Rectangle.Area = uVar7;
  *(undefined4 *)((long)&(this->container).super_Rectangle.Area + 4) = uVar8;
  (this->container).super_Rectangle.X = iVar2;
  (this->container).super_Rectangle.Y = iVar3;
  (this->container).super_Rectangle.Dx = iVar4;
  (this->container).super_Rectangle.Dy = iVar5;
  (this->inputParameters).SolutionAlgorithm = inputParameters->SolutionAlgorithm;
  (this->inputParameters).OutputPath._M_dataplus._M_p =
       (pointer)&(this->inputParameters).OutputPath.field_2;
  pcVar1 = (inputParameters->OutputPath)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->inputParameters).OutputPath,pcVar1,
             pcVar1 + (inputParameters->OutputPath)._M_string_length);
  (this->inputParameters).LMAOThreads = inputParameters->LMAOThreads;
  uVar9 = *(undefined3 *)&inputParameters->field_0x29;
  iVar2 = inputParameters->LMAOTimeLimit;
  (this->inputParameters).LMAOEnableLogging = inputParameters->LMAOEnableLogging;
  *(undefined3 *)&(this->inputParameters).field_0x29 = uVar9;
  (this->inputParameters).LMAOTimeLimit = iVar2;
  (this->inputParameters).LMAOLogFileName._M_dataplus._M_p =
       (pointer)&(this->inputParameters).LMAOLogFileName.field_2;
  pcVar1 = (inputParameters->LMAOLogFileName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->inputParameters).LMAOLogFileName,pcVar1,
             pcVar1 + (inputParameters->LMAOLogFileName)._M_string_length);
  (this->inputParameters).TSBPThreads = inputParameters->TSBPThreads;
  uVar9 = *(undefined3 *)&inputParameters->field_0x59;
  iVar2 = inputParameters->TSBPTimeLimit;
  (this->inputParameters).TSBPEnableLogging = inputParameters->TSBPEnableLogging;
  *(undefined3 *)&(this->inputParameters).field_0x59 = uVar9;
  (this->inputParameters).TSBPTimeLimit = iVar2;
  (this->inputParameters).TSBPLogFileName._M_dataplus._M_p =
       (pointer)&(this->inputParameters).TSBPLogFileName.field_2;
  pcVar1 = (inputParameters->TSBPLogFileName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->inputParameters).TSBPLogFileName,pcVar1,
             pcVar1 + (inputParameters->TSBPLogFileName)._M_string_length);
  memset(&this->solutionStatistics,0,200);
  (this->solution).ReducedItemInfeasiblePlacementPoints = 0xffffffffffffffff;
  (this->solution).IsReducedItemPlaced = false;
  (this->solution).IsFixedItemPlaced = false;
  (this->branchAndBoundSearch)._M_t.
  super___uniq_ptr_impl<tsbp::IBranchAndBoundSolver,_std::default_delete<tsbp::IBranchAndBoundSolver>_>
  ._M_t.
  super__Tuple_impl<0UL,_tsbp::IBranchAndBoundSolver_*,_std::default_delete<tsbp::IBranchAndBoundSolver>_>
  .super__Head_base<0UL,_tsbp::IBranchAndBoundSolver_*,_false>._M_head_impl =
       (IBranchAndBoundSolver *)0x0;
  return;
}

Assistant:

OrthogonalPackingSolver2D(const std::vector<Rectangle>& items, const Bin& container, const InputParameters& inputParameters)
        :
        items(items),
        container(container),
        inputParameters(inputParameters) {}